

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationShaderInputOutputTests.cpp
# Opt level: O1

TestStatus *
vkt::tessellation::anon_unknown_1::Barrier::test
          (TestStatus *__return_storage_ptr__,Context *context)

{
  int i;
  undefined8 *vertexData;
  long lVar1;
  value_type_conflict3 *__val;
  TextureLevel referenceImage;
  ConstPixelBufferAccess local_48;
  
  vertexData = (undefined8 *)operator_new(0x80);
  *vertexData = 0;
  vertexData[1] = 0;
  vertexData[2] = 0;
  vertexData[3] = 0;
  vertexData[4] = 0;
  vertexData[5] = 0;
  vertexData[6] = 0;
  vertexData[7] = 0;
  vertexData[8] = 0;
  vertexData[9] = 0;
  vertexData[10] = 0;
  vertexData[0xb] = 0;
  vertexData[0xc] = 0;
  vertexData[0xd] = 0;
  vertexData[0xe] = 0;
  vertexData[0xf] = 0;
  lVar1 = 0;
  do {
    *(float *)((long)vertexData + lVar1 * 4) = (float)(int)lVar1 / 31.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x20);
  tcu::TextureLevel::TextureLevel(&referenceImage);
  tcu::ImageIO::loadPNG
            (&referenceImage,context->m_testCtx->m_curArchive,
             "vulkan/data/tessellation/barrier_ref.png");
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_48,&referenceImage);
  runTest(__return_storage_ptr__,context,1,0x20,0x20,VK_FORMAT_R32_SFLOAT,vertexData,0x80,&local_48)
  ;
  tcu::TextureLevel::~TextureLevel(&referenceImage);
  operator_delete(vertexData,0x80);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context)
{
	// Input vertex attribute data
	std::vector<float> vertexData		(NUM_VERTICES);
	const VkDeviceSize vertexBufferSize = sizeof(float) * vertexData.size();

	for (int i = 0; i < NUM_VERTICES; ++i)
		vertexData[i] = static_cast<float>(i) / (NUM_VERTICES - 1);

	tcu::TextureLevel referenceImage;
	tcu::ImageIO::loadPNG(referenceImage, context.getTestContext().getArchive(), "vulkan/data/tessellation/barrier_ref.png");

	const int numPrimitives = 1;
	const int inPatchSize   = NUM_VERTICES;
	const int outPatchSize  = NUM_VERTICES;

	return runTest(context, numPrimitives, inPatchSize, outPatchSize,
				   VK_FORMAT_R32_SFLOAT, &vertexData[0], vertexBufferSize, referenceImage.getAccess());
}